

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

int __thiscall V2Synth::init(V2Synth *this,EVP_PKEY_CTX *ctx)

{
  V2Instance *this_00;
  int iVar1;
  uint32_t in_EDX;
  V2Voice *this_01;
  V2Chan *this_02;
  int i;
  long lVar2;
  
  memset(this,0,0x280650);
  this->samplerate = in_EDX;
  this_00 = &this->instance;
  V2Instance::calcNewSampleRate(this_00,in_EDX);
  ronanCBSetSR((syWRonan *)&this->ronan,in_EDX);
  this->patchmap = (V2PatchMap *)ctx;
  this_01 = this->voicesw;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    this->chanmap[lVar2] = -1;
    V2Voice::init(this_01,(EVP_PKEY_CTX *)this_00);
    this_01 = this_01 + 1;
  }
  this_02 = this->chansw;
  for (lVar2 = 0x25f; lVar2 != 0x2df; lVar2 = lVar2 + 8) {
    *(undefined1 *)((long)this->chanmap + lVar2 + -0x14) = 0x7f;
    V2Chan::init(this_02,(EVP_PKEY_CTX *)this_00);
    this_02 = this_02 + 1;
  }
  V2Reverb::init(&this->reverb,(EVP_PKEY_CTX *)this_00);
  (this->delay).db[0] = this->maindelbuf[0];
  (this->delay).db[1] = this->maindelbuf[1];
  (this->delay).dbufmask = 0x7fff;
  (this->delay).inst = this_00;
  V2ModDel::reset(&this->delay);
  ronanCBInit((syWRonan *)&this->ronan);
  iVar1 = V2Comp::init(&this->compr,(EVP_PKEY_CTX *)this_00);
  (this->dcf).inst = this_00;
  (this->dcf).fl.xm1 = 0.0;
  (this->dcf).fl.ym1 = 0.0;
  (this->dcf).fr.xm1 = 0.0;
  (this->dcf).fr.ym1 = 0.0;
  this->initialized = true;
  return iVar1;
}

Assistant:

void init(const void *patchmap, int samplerate)
    {
        // Ahem, so this is somewhat dubious, but we don't use
        // virtual functions or anything so it should be fine. Ahem.
        // Look away please :)
        memset(this, 0, sizeof(*this));

        // set sampling rate
        this->samplerate = samplerate;
        instance.calcNewSampleRate(samplerate);
        ronanCBSetSR(&ronan, samplerate);

        // patch map
        this->patchmap = (const V2PatchMap*)patchmap;

        // init voices
        for (int i = 0; i < POLY; i++)
        {
            chanmap[i] = -1;
            voicesw[i].init(&instance);
        }

        // init channels
        for (int i = 0; i < CHANS; i++)
        {
            chans[i].ctl[6] = 0x7f;
            chansw[i].init(&instance, chandelbuf[i][0], chandelbuf[i][1], COUNTOF(chandelbuf[i][0]));
        }

        // global filters
        reverb.init(&instance);
        delay.init(&instance, maindelbuf[0], maindelbuf[1], COUNTOF(maindelbuf[0]));
        ronanCBInit(&ronan);
        compr.init(&instance);
        dcf.init(&instance);

        // debug plots (uncomment the ones you want)
        //int sr_plot = 44100/10; // plot rate
        //int sr_lfo = 800;
        //int w = 800, h = 150;

        //DEBUG_PLOT_OPEN(&voicesw[1].osc[0], "Voice 1 VCO 0", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].osc[1], "Voice 1 VCO 1", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].vcf[0], "Voice 1 VCF 0", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].env[0], "Voice 1 Env 0", sr_lfo, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].lfo[0], "Voice 1 LFO 0", sr_lfo, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1].dist, "Voice 1 Dist", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(&voicesw[1], "Voice 1 final", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0].dcf1, 0), "Chan 0 DCF1 L", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0].dcf1, 1), "Chan 0 DCF1 R", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0], 0), "Channel 0 L", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&chansw[0], 1), "Channel 0 R", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&instance.mixbuf, 0), "Mix L", sr_plot, w, h);
        //DEBUG_PLOT_OPEN(DEBUG_PLOT_CHAN(&instance.mixbuf, 1), "Mix R", sr_plot, w, h);

        initialized = true;
    }